

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompletionModel::filter(QCompletionModel *this,QStringList *parts)

{
  arrow_operator_result ppQVar1;
  QCompletionEngine *pQVar2;
  ulong uVar3;
  long in_RDI;
  QStringList *unaff_retaddr;
  QCompletionEngine *in_stack_00000008;
  QCompletionModelPrivate *d;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *in_stack_ffffffffffffffd0;
  QAbstractItemModel *pQVar4;
  
  d_func((QCompletionModel *)0xa69f61);
  QAbstractItemModel::beginResetModel();
  QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
            ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
             (in_RDI + 0x18));
  QCompletionEngine::filter(in_stack_00000008,unaff_retaddr);
  QAbstractItemModel::endResetModel();
  ppQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
            ::operator->(in_stack_ffffffffffffffd0);
  pQVar4 = *ppQVar1;
  pQVar2 = QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
                     ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                       *)(in_RDI + 0x18));
  uVar3 = (**(code **)(*(long *)pQVar4 + 0x130))(pQVar4,&pQVar2->curParent);
  if ((uVar3 & 1) != 0) {
    ppQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              ::operator->(in_stack_ffffffffffffffd0);
    pQVar4 = *ppQVar1;
    pQVar2 = QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::
             operator->((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                         *)(in_RDI + 0x18));
    (**(code **)(*(long *)pQVar4 + 0x128))(pQVar4,&pQVar2->curParent);
  }
  return;
}

Assistant:

void QCompletionModel::filter(const QStringList& parts)
{
    Q_D(QCompletionModel);
    beginResetModel();
    engine->filter(parts);
    endResetModel();

    if (d->model->canFetchMore(engine->curParent))
        d->model->fetchMore(engine->curParent);
}